

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

value_type * __thiscall
wasm::Random::
pick<std::vector<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),std::allocator<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>>>
          (Random *this,
          vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
          *vec)

{
  pointer poVar1;
  pointer poVar2;
  uint32_t uVar3;
  
  poVar1 = (vec->
           super__Vector_base<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar2 = (vec->
           super__Vector_base<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (poVar1 != poVar2) {
    uVar3 = upTo(this,(uint32_t)((ulong)((long)poVar2 - (long)poVar1) >> 4));
    return (vec->
           super__Vector_base<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
           )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar3 * 2;
  }
  __assert_fail("!vec.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                ,0x50,
                "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<wasm::Expression *(wasm::TranslateToFuzzReader::*)(wasm::Type)>]"
               );
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }